

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

bool EqualsIgnoreCase(string *s1,string *s2,locale *loc)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  ctype *pcVar6;
  size_type sVar7;
  bool bVar8;
  
  pcVar6 = std::use_facet<std::ctype<char>>(loc);
  sVar1 = s1->_M_string_length;
  if (sVar1 == s2->_M_string_length) {
    bVar8 = sVar1 == 0;
    if (!bVar8) {
      pcVar2 = (s1->_M_dataplus)._M_p;
      pcVar3 = (s2->_M_dataplus)._M_p;
      cVar5 = *pcVar3;
      cVar4 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)*pcVar2);
      cVar5 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar5);
      if (cVar4 == cVar5) {
        sVar7 = 1;
        do {
          bVar8 = sVar1 == sVar7;
          if (bVar8) {
            return bVar8;
          }
          cVar5 = pcVar3[sVar7];
          cVar4 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)pcVar2[sVar7]);
          cVar5 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar5);
          sVar7 = sVar7 + 1;
        } while (cVar4 == cVar5);
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

inline bool EqualsIgnoreCase(const std::string& s1, const std::string& s2, const std::locale& loc = std::locale()) {
    const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
    const auto compareCharLower = [&](char c1, char c2) { return ctype.tolower(c1) == ctype.tolower(c2); };
    return s1.size() == s2.size() && std::equal(s1.begin(), s1.end(), s2.begin(), compareCharLower);
}